

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::PtexReader
          (PtexReader *this,bool premultiply,PtexInputHandler *io,PtexErrorHandler *err)

{
  DefaultInputHandler *pDVar1;
  
  (this->super_PtexTexture)._vptr_PtexTexture = (_func_int **)&PTR__PtexReader_02d9d5d0;
  pthread_mutex_init((pthread_mutex_t *)&this->readlock,(pthread_mutexattr_t *)0x0);
  (this->_defaultIo).super_PtexInputHandler._vptr_PtexInputHandler =
       (_func_int **)&PTR__PtexInputHandler_02d9d928;
  (this->_defaultIo).buffer = (char *)0x0;
  pDVar1 = &this->_defaultIo;
  if (io != (PtexInputHandler *)0x0) {
    pDVar1 = (DefaultInputHandler *)io;
  }
  this->_io = &pDVar1->super_PtexInputHandler;
  this->_err = err;
  this->_premultiply = premultiply;
  this->_ok = true;
  this->_needToOpen = true;
  this->_pendingPurge = false;
  this->_fp = (Handle)0x0;
  this->_pos = 0;
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  (this->_path)._M_string_length = 0;
  (this->_path).field_2._M_local_buf[0] = '\0';
  this->_pixelsize = 0;
  this->_constdata = (uint8_t *)0x0;
  this->_metadata = (MetaData *)0x0;
  this->_hasEdits = false;
  memset(&this->_faceinfo,0,0xa8);
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::PtexHashMap
            (&this->_reductions);
  (this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_baseMemUsed = 0x2c8;
  this->_memUsed = 0x2c8;
  this->_opens = 0;
  this->_blockReads = 0;
  (this->_zstream).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->_zstream).avail_in = 0;
  (this->_zstream).total_in = 0;
  (this->_zstream).next_out = (Bytef *)0x0;
  *(undefined8 *)&(this->_zstream).avail_out = 0;
  (this->_zstream).total_out = 0;
  (this->_zstream).msg = (char *)0x0;
  (this->_zstream).state = (internal_state *)0x0;
  (this->_zstream).zalloc = (alloc_func)0x0;
  (this->_zstream).zfree = (free_func)0x0;
  (this->_zstream).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->_zstream).data_type = 0;
  (this->_zstream).adler = 0;
  (this->_zstream).reserved = 0;
  return;
}

Assistant:

PtexReader::PtexReader(bool premultiply, PtexInputHandler* io, PtexErrorHandler* err)
    : _io(io ? io : &_defaultIo),
      _err(err),
      _premultiply(premultiply),
      _ok(true),
      _needToOpen(true),
      _pendingPurge(false),
      _fp(0),
      _pos(0),
      _pixelsize(0),
      _constdata(0),
      _metadata(0),
      _hasEdits(false),
      _baseMemUsed(sizeof(*this)),
      _memUsed(_baseMemUsed),
      _opens(0),
      _blockReads(0)
{
    memset(&_zstream, 0, sizeof(_zstream));
}